

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CCallMethodExp *exp)

{
  IExpression *pIVar1;
  CError *this_00;
  CExpList *pCVar2;
  undefined8 *puVar3;
  bool bVar4;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ostream *poVar6;
  __shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  TypeInfo *pTVar9;
  CError *pCVar10;
  string *psVar11;
  long lVar12;
  undefined1 local_140 [8];
  string local_138;
  TypeInfo *local_110;
  mapped_type classInfo;
  string errorMessage;
  mapped_type argumentInfo;
  shared_ptr<VariablesInfo> argumentsInfo;
  mapped_type methodInfo;
  string methodName;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_80;
  string identifierName;
  string errorMessage_1;
  
  std::operator<<((ostream *)&std::cout,"typechecker: CCallMethodExp\n");
  if (((exp->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t.
       super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
       super__Head_base<0UL,_CExpList_*,_false>._M_head_impl == (CExpList *)0x0) ||
     ((exp->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl == (CIdExp *)0x0)) {
    CError::CError((CError *)local_140,&CError::AST_ERROR_abi_cxx11_,
                   &(exp->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_140);
    std::__cxx11::string::~string((string *)local_140);
    TypeInfo::TypeInfo((TypeInfo *)local_140,ERROR_TYPE);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_140);
    psVar11 = (string *)(local_140 + 8);
    goto LAB_0011c0af;
  }
  std::__cxx11::string::string
            ((string *)&identifierName,
             (string *)
             (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pIVar1 = (exp->objectExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 == (IExpression *)0x0) {
LAB_0011bcf0:
    std::__cxx11::string::string
              ((string *)&methodName,
               (string *)
               &((exp->methodName)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
                 _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                 super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
    p_Var5 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(this->table).
                              super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &identifierName)->
              super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&methodName);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,(string *)
                                    classInfo.
                                    super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    std::operator<<(poVar6,"\n");
    pTVar9 = (TypeInfo *)(ulong)(pIVar1 == (IExpression *)0x0);
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,&classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>);
    bVar4 = checkMethodVisibility
                      (this,&methodName,(shared_ptr<ClassInfo> *)&local_80,
                       pIVar1 == (IExpression *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    if (bVar4) {
      p_Var7 = &std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(classInfo.
                                  super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                 ->methods,&methodName)->
                super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,p_Var7);
      this_00 = (CError *)
                ((((methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                variables)._M_h._M_element_count;
      pCVar2 = (exp->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>._M_t
               .super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
               super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
      pCVar10 = (CError *)
                ((long)*(pointer *)
                        ((long)&(pCVar2->exps).
                                super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                        + 8) -
                 *(long *)&(pCVar2->exps).
                           super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                           ._M_impl >> 3);
      if (this_00 == pCVar10) {
        std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&argumentsInfo.super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
                   &((methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>);
        local_110 = &this->lastCalculatedType;
        lVar12 = 0;
        for (pCVar10 = (CError *)0x0; this_00 != pCVar10;
            pCVar10 = (CError *)((long)&(pCVar10->message)._M_dataplus._M_p + 1)) {
          p_Var8 = &std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VariableInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)argumentsInfo.
                                    super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,
                                 (key_type *)
                                 ((long)&((((argumentsInfo.
                                             super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->variableNames).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar12))->
                    super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>,
                     p_Var8);
          puVar3 = *(undefined8 **)
                    (*(long *)&(((exp->args)._M_t.
                                 super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
                                 super__Head_base<0UL,_CExpList_*,_false>._M_head_impl)->exps).
                               super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                               ._M_impl + (long)pCVar10 * 8);
          if (puVar3 != (undefined8 *)0x0) {
            (**(code **)*puVar3)(puVar3,this);
            TypeInfo::TypeInfo((TypeInfo *)&errorMessage,
                               ((argumentInfo.
                                 super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                )->type).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
            bVar4 = operator!=(local_110,(TypeInfo *)&errorMessage);
            if (bVar4) {
              CError::GetTypeErrorMessage_abi_cxx11_
                        (&errorMessage_1,(CError *)&errorMessage,local_110,pTVar9);
              CError::CError((CError *)local_140,&errorMessage_1,
                             (PositionInfo *)
                             (*(long *)(*(long *)&(((exp->args)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>
                                                  .super__Head_base<0UL,_CExpList_*,_false>.
                                                  _M_head_impl)->exps).
                                                  super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                                                  ._M_impl + (long)pCVar10 * 8) + 8));
              std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                        (&this->errors,(CError *)local_140);
              std::__cxx11::string::~string((string *)local_140);
              TypeInfo::TypeInfo((TypeInfo *)local_140,ERROR_TYPE);
              TypeInfo::operator=(local_110,(TypeInfo *)local_140);
              std::__cxx11::string::~string((string *)(local_140 + 8));
              std::__cxx11::string::~string((string *)&errorMessage_1);
              std::__cxx11::string::~string((string *)&errorMessage._M_string_length);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              goto LAB_0011c076;
            }
            std::__cxx11::string::~string((string *)&errorMessage._M_string_length);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&argumentInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          lVar12 = lVar12 + 0x20;
        }
        TypeInfo::operator=(local_110,
                            ((methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->returnType).
                            super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_0011c076:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&argumentsInfo.super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        CError::GetNumberOfArgsMessage_abi_cxx11_
                  (&errorMessage,this_00,(unsigned_long)pCVar10,(unsigned_long)pTVar9);
        CError::CError((CError *)local_140,&errorMessage,
                       &(exp->super_IExpression).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_140);
        std::__cxx11::string::~string((string *)local_140);
        TypeInfo::TypeInfo((TypeInfo *)local_140,ERROR_TYPE);
        TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_140);
        std::__cxx11::string::~string((string *)(local_140 + 8));
        std::__cxx11::string::~string((string *)&errorMessage);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      CError::GetHasNoMemberErrorMessage(&errorMessage,&identifierName,&methodName);
      CError::CError((CError *)local_140,&errorMessage,
                     (PositionInfo *)
                     ((long)&(((exp->methodName)._M_t.
                               super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                               super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                               super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->
                             super_IExpression).super_PositionedNode + 8));
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)&errorMessage);
      TypeInfo::TypeInfo((TypeInfo *)local_140,ERROR_TYPE);
      TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_140);
      std::__cxx11::string::~string((string *)(local_140 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar11 = &methodName;
LAB_0011c0a2:
    std::__cxx11::string::~string((string *)psVar11);
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    TypeInfo::TypeInfo((TypeInfo *)local_140,ERROR_TYPE);
    pTVar9 = &this->lastCalculatedType;
    bVar4 = operator==(pTVar9,(TypeInfo *)local_140);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    if (!bVar4) {
      std::__cxx11::string::_M_assign((string *)&identifierName);
      if (pTVar9->isPrimitive != true) goto LAB_0011bcf0;
      CError::CError((CError *)local_140,&CError::IS_NOT_CALLABLE_abi_cxx11_,
                     &(exp->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      TypeInfo::TypeInfo((TypeInfo *)local_140,ERROR_TYPE);
      TypeInfo::operator=(pTVar9,(TypeInfo *)local_140);
      psVar11 = (string *)(local_140 + 8);
      goto LAB_0011c0a2;
    }
  }
  psVar11 = &identifierName;
LAB_0011c0af:
  std::__cxx11::string::~string((string *)psVar11);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CCallMethodExp &exp )
{
    std::cout << "typechecker: CCallMethodExp\n";

    if( exp.args && exp.methodName ) {
        std::string identifierName = currentClass->name;
        bool isThis = true;
        if ( exp.objectExpression ) {
            exp.objectExpression->Accept( *this );
            if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
                return;
            }
            identifierName = lastCalculatedType.className;
            isThis = false;
            if( lastCalculatedType.isPrimitive ) {
                errors.push_back( CError( CError::IS_NOT_CALLABLE, exp.position ) );
                lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
                return;
            }
        }

		auto methodName = exp.methodName->name;
        auto classInfo = table->classes[identifierName];
        std::cout << methodName << " " << classInfo->name << " " << isThis << "\n";
		if( !checkMethodVisibility( methodName, classInfo, isThis ) ) {
			errors.push_back( CError( CError::GetHasNoMemberErrorMessage( identifierName, methodName ), exp.methodName->position ) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
			return;
		}
		auto methodInfo = classInfo->methods[methodName];
		auto expectedNumberOfArguments = methodInfo->arguments->variables.size();
        auto gotNumberOfArguments = exp.args->exps.size();
        if( expectedNumberOfArguments != gotNumberOfArguments ) {
			auto errorMessage = CError::GetNumberOfArgsMessage( expectedNumberOfArguments, gotNumberOfArguments );
			errors.push_back( CError( errorMessage, exp.position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
			return;
		}
        auto argumentsInfo = methodInfo->arguments;
        for( int index = 0; index < gotNumberOfArguments; ++index ) {
            auto argumentInfo = argumentsInfo->variables[argumentsInfo->variableNames[index]];
            if( exp.args->exps[index] ) {
                exp.args->exps[index]->Accept( *this );
                auto expectedArgumentType = *( argumentInfo->type );
                if( lastCalculatedType != expectedArgumentType ) {
                    auto errorMessage = CError::GetTypeErrorMessage(expectedArgumentType, lastCalculatedType);
                    errors.push_back( CError( errorMessage, exp.args->exps[index]->position ) );
                    lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
                    return;
                }
            }
		}
		lastCalculatedType = *( methodInfo->returnType );
	} else {
		errors.push_back( CError( CError::AST_ERROR, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
    }
}